

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_linux.c
# Opt level: O0

uint8_t * os_fd_linux_skip_rawsocket_prefix(uint8_t *ptr,ssize_t *len,int af_type)

{
  int iVar1;
  int header_size;
  int af_type_local;
  ssize_t *len_local;
  uint8_t *ptr_local;
  
  ptr_local = ptr;
  if (af_type == 2) {
    iVar1 = (*ptr & 0xf) << 2;
    *len = *len - (long)iVar1;
    ptr_local = ptr + iVar1;
  }
  return ptr_local;
}

Assistant:

uint8_t *
os_fd_linux_skip_rawsocket_prefix(uint8_t *ptr, ssize_t *len, int af_type) {
  int header_size;

  if (af_type != AF_INET) {
    return ptr;
  }

  /* skip IPv4 header */
  header_size = (ptr[0] & 0x0f) << 2;

  *len -= header_size;
  return ptr + header_size;
}